

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::getWritableListPointer
          (ListBuilder *__return_storage_ptr__,WirePointer *origRef,word *origRefTarget,
          SegmentBuilder *origSegment,CapTableBuilder *capTable,ElementSize elementSize,
          word *defaultValue,BuilderArena *orphanArena)

{
  undefined8 uVar1;
  word *pwVar2;
  bool bVar3;
  WordCountN<17> WVar4;
  ListElementCount size;
  BitsPerElementN<23> step_00;
  ElementCountN<29> size_00;
  uint step;
  Fault f_9;
  uint *local_2a0;
  undefined1 local_298 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition_8;
  Fault f_8;
  uint *local_260;
  undefined1 local_258 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition_7;
  Fault f_7;
  ElementSize *local_220;
  undefined1 local_218 [8];
  DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> _kjCondition_6;
  Fault f_6;
  ElementSize *local_1e0;
  undefined1 local_1d8 [8];
  DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> _kjCondition_5;
  uint pointerCount_1;
  uint dataSize_1;
  Fault f_5;
  unsigned_short *local_198;
  undefined1 local_190 [8];
  DebugComparison<unsigned_short_&,_unsigned_int> _kjCondition_4;
  Fault f_4;
  unsigned_short *local_158;
  undefined1 local_150 [8];
  DebugComparison<unsigned_short_&,_unsigned_int> _kjCondition_3;
  Fault f_3;
  unsigned_short pointerCount;
  unsigned_short dataSize;
  Fault f_2;
  Kind local_108;
  DebugExpression<capnp::_::WirePointer::Kind> local_104;
  undefined1 local_100 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_2;
  WirePointer *tag;
  ElementSize oldSize;
  Fault f_1;
  Kind local_c0;
  DebugExpression<capnp::_::WirePointer::Kind> local_bc;
  undefined1 local_b8 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  word *ptr;
  SegmentBuilder *segment;
  WirePointer *ref;
  Fault local_70;
  Fault f;
  ElementSize *local_60;
  undefined1 local_58 [8];
  DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> _kjCondition;
  ElementSize elementSize_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *origSegment_local;
  word *origRefTarget_local;
  WirePointer *origRef_local;
  
  _kjCondition._39_1_ = elementSize;
  capTable_local = (CapTableBuilder *)origSegment;
  origSegment_local = (SegmentBuilder *)origRefTarget;
  origRefTarget_local = (word *)origRef;
  local_60 = (ElementSize *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition.field_0x27);
  f.exception._7_1_ = 7;
  kj::_::DebugExpression<capnp::ElementSize&>::operator!=
            ((DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_58,
             (DebugExpression<capnp::ElementSize&> *)&local_60,
             (ElementSize *)((long)&f.exception + 7));
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[53]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x4f2,FAILED,"elementSize != ElementSize::INLINE_COMPOSITE",
               "_kjCondition,\"Use getWritableStructListPointer() for struct lists.\"",
               (DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_58,
               (char (*) [53])"Use getWritableStructListPointer() for struct lists.");
    kj::_::Debug::Fault::fatal(&local_70);
  }
  bVar3 = WirePointer::isNull((WirePointer *)origRefTarget_local);
  if (bVar3) goto LAB_00591014;
  do {
    segment = (SegmentBuilder *)origRefTarget_local;
    ptr = (word *)capTable_local;
    _kjCondition_1._24_8_ =
         followFars((WirePointer **)&segment,(word *)origSegment_local,(SegmentBuilder **)&ptr);
    local_c0 = WirePointer::kind((WirePointer *)segment);
    local_bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
    f_1.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_b8
               ,&local_bc,(Kind *)((long)&f_1.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
    if (bVar3) {
      tag._7_1_ = WirePointer::ListRef::elementSize
                            ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
      if (tag._7_1_ == INLINE_COMPOSITE) {
        _kjCondition_2.result = _kjCondition_1.result;
        _kjCondition_2._25_7_ = _kjCondition_1._25_7_;
        local_108 = WirePointer::kind((WirePointer *)_kjCondition_1._24_8_);
        local_104 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_108);
        f_2.exception._4_4_ = 0;
        kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                  ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_100,&local_104,(Kind *)((long)&f_2.exception + 4));
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_100);
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    ((Fault *)&stack0xfffffffffffffee8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x518,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      local_100,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
        }
        _kjCondition_1._24_8_ = _kjCondition_1._24_8_ + 8;
        f_3.exception._6_2_ =
             DirectWireValue<unsigned_short>::get
                       ((DirectWireValue<unsigned_short> *)(_kjCondition_2._24_8_ + 4));
        f_3.exception._4_2_ =
             DirectWireValue<unsigned_short>::get
                       ((DirectWireValue<unsigned_short> *)(_kjCondition_2._24_8_ + 6));
        switch(_kjCondition._39_1_) {
        case (BADTYPE)0x0:
        default:
switchD_005912a7_default:
          pwVar2 = ptr;
          uVar1 = _kjCondition_1._24_8_;
          WVar4 = WirePointer::StructRef::wordSize((StructRef *)(_kjCondition_2._24_8_ + 4));
          size = WirePointer::inlineCompositeListElementCount((WirePointer *)_kjCondition_2._24_8_);
          ListBuilder::ListBuilder
                    (__return_storage_ptr__,(SegmentBuilder *)pwVar2,capTable,(void *)uVar1,
                     WVar4 << 6,size,(uint)f_3.exception._6_2_ << 6,f_3.exception._4_2_,
                     INLINE_COMPOSITE);
          return __return_storage_ptr__;
        case (BADTYPE)0x1:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[123]>
                    ((Fault *)&_kjCondition_3.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x526,FAILED,(char *)0x0,
                     "\"Schema mismatch: Found struct list where bit list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                     ,(char (*) [123])
                      "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3.result);
          break;
        case (BADTYPE)0x2:
        case (BADTYPE)0x3:
        case (BADTYPE)0x4:
        case (BADTYPE)0x5:
          local_158 = (unsigned_short *)
                      kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (unsigned_short *)((long)&f_3.exception + 6));
          f_4.exception._4_4_ = 1;
          kj::_::DebugExpression<unsigned_short&>::operator>=
                    ((DebugComparison<unsigned_short_&,_unsigned_int> *)local_150,
                     (DebugExpression<unsigned_short&> *)&local_158,
                     (uint *)((long)&f_4.exception + 4));
          bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
          if (bVar3) goto switchD_005912a7_default;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                    ((Fault *)&_kjCondition_4.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x530,FAILED,"dataSize >= ONE * WORDS",
                     "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                     ,(DebugComparison<unsigned_short_&,_unsigned_int> *)local_150,
                     (char (*) [73])
                     "Schema mismatch: Existing list value is incompatible with expected type.");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_4.result);
          break;
        case (BADTYPE)0x6:
          local_198 = (unsigned_short *)
                      kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (unsigned_short *)((long)&f_3.exception + 4));
          f_5.exception._4_4_ = 1;
          kj::_::DebugExpression<unsigned_short&>::operator>=
                    ((DebugComparison<unsigned_short_&,_unsigned_int> *)local_190,
                     (DebugExpression<unsigned_short&> *)&local_198,
                     (uint *)((long)&f_5.exception + 4));
          bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
          if (bVar3) {
            _kjCondition_1._24_8_ = _kjCondition_1._24_8_ + (long)(int)(uint)f_3.exception._6_2_ * 8
            ;
            goto switchD_005912a7_default;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                    ((Fault *)&pointerCount_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x537,FAILED,"pointerCount >= ONE * POINTERS",
                     "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                     ,(DebugComparison<unsigned_short_&,_unsigned_int> *)local_190,
                     (char (*) [73])
                     "Schema mismatch: Existing list value is incompatible with expected type.");
          kj::_::Debug::Fault::~Fault((Fault *)&pointerCount_1);
          break;
        case (BADTYPE)0x7:
          kj::_::unreachable();
        }
      }
      else {
        _kjCondition_5._36_4_ = dataBitsPerElement(tag._7_1_);
        _kjCondition_5._32_4_ = pointersPerElement(tag._7_1_);
        if (_kjCondition._39_1_ == '\x01') {
          local_1e0 = (ElementSize *)
                      kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (ElementSize *)((long)&tag + 7));
          f_6.exception._7_1_ = 1;
          kj::_::DebugExpression<capnp::ElementSize&>::operator==
                    ((DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_1d8,
                     (DebugExpression<capnp::ElementSize&> *)&local_1e0,
                     (ElementSize *)((long)&f_6.exception + 7));
          bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d8);
          if (bVar3) {
LAB_005917cb:
            pwVar2 = ptr;
            uVar1 = _kjCondition_1._24_8_;
            step_00 = _kjCondition_5._36_4_ + _kjCondition_5._32_4_ * 0x40;
            size_00 = WirePointer::ListRef::elementCount
                                ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
            ListBuilder::ListBuilder
                      (__return_storage_ptr__,(SegmentBuilder *)pwVar2,capTable,(void *)uVar1,
                       step_00,size_00,_kjCondition_5._36_4_,_kjCondition_5._32_2_,tag._7_1_);
            return __return_storage_ptr__;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                    ((Fault *)&_kjCondition_6.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x54e,FAILED,"oldSize == ElementSize::BIT",
                     "_kjCondition,\"Schema mismatch: Found non-bit list where bit list was expected.\""
                     ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_1d8,
                     (char (*) [65])
                     "Schema mismatch: Found non-bit list where bit list was expected.");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_6.result);
        }
        else {
          local_220 = (ElementSize *)
                      kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (ElementSize *)((long)&tag + 7));
          f_7.exception._7_1_ = 1;
          kj::_::DebugExpression<capnp::ElementSize&>::operator!=
                    ((DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_218,
                     (DebugExpression<capnp::ElementSize&> *)&local_220,
                     (ElementSize *)((long)&f_7.exception + 7));
          bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
          if (bVar3) {
            local_260 = (uint *)kj::_::DebugExpressionStart::operator<<
                                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                           (uint *)&_kjCondition_5.field_0x24);
            f_8.exception._4_4_ = dataBitsPerElement(_kjCondition._39_1_);
            kj::_::DebugExpression<unsigned_int&>::operator>=
                      ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_258,
                       (DebugExpression<unsigned_int&> *)&local_260,
                       (uint *)((long)&f_8.exception + 4));
            bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_258);
            if (bVar3) {
              local_2a0 = (uint *)kj::_::DebugExpressionStart::operator<<
                                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                             (uint *)&_kjCondition_5.result);
              f_9.exception._4_4_ = pointersPerElement(_kjCondition._39_1_);
              kj::_::DebugExpression<unsigned_int&>::operator>=
                        ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_298,
                         (DebugExpression<unsigned_int&> *)&local_2a0,
                         (uint *)((long)&f_9.exception + 4));
              bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
              if (bVar3) goto LAB_005917cb;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                        ((Fault *)&stack0xfffffffffffffd50,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x55b,FAILED,"pointerCount >= pointersPerElement(elementSize) * ELEMENTS",
                         "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                         ,(DebugComparison<unsigned_int_&,_unsigned_int> *)local_298,
                         (char (*) [73])
                         "Schema mismatch: Existing list value is incompatible with expected type.")
              ;
              kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffd50);
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                        ((Fault *)&_kjCondition_8.result,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x557,FAILED,"dataSize >= dataBitsPerElement(elementSize) * ELEMENTS",
                         "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                         ,(DebugComparison<unsigned_int_&,_unsigned_int> *)local_258,
                         (char (*) [73])
                         "Schema mismatch: Existing list value is incompatible with expected type.")
              ;
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_8.result);
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                      ((Fault *)&_kjCondition_7.result,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x553,FAILED,"oldSize != ElementSize::BIT",
                       "_kjCondition,\"Schema mismatch: Found bit list where non-bit list was expected.\""
                       ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_218,
                       (char (*) [65])
                       "Schema mismatch: Found bit list where non-bit list was expected.");
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_7.result);
          }
        }
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                ((Fault *)&stack0xffffffffffffff30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x509,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  local_b8,
                 (char (*) [85])
                 "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff30);
    }
LAB_00591014:
    if ((defaultValue == (word *)0x0) ||
       (bVar3 = WirePointer::isNull((WirePointer *)defaultValue), bVar3)) {
      ListBuilder::ListBuilder(__return_storage_ptr__,_kjCondition._39_1_);
      return __return_storage_ptr__;
    }
    origSegment_local =
         (SegmentBuilder *)
         copyMessage((SegmentBuilder **)&capTable_local,capTable,
                     (WirePointer **)&origRefTarget_local,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder getWritableListPointer(
      WirePointer* origRef, word* origRefTarget,
      SegmentBuilder* origSegment, CapTableBuilder* capTable, ElementSize elementSize,
      const word* defaultValue, BuilderArena* orphanArena = nullptr)) {
    KJ_DREQUIRE(elementSize != ElementSize::INLINE_COMPOSITE,
             "Use getWritableStructListPointer() for struct lists.");

    if (origRef->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListBuilder(elementSize);
      }
      origRefTarget = copyMessage(
          origSegment, capTable, origRef, reinterpret_cast<const WirePointer*>(defaultValue));
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    // We must verify that the pointer has the right size.  Unlike in
    // getWritableStructListPointer(), we never need to "upgrade" the data, because this
    // method is called only for non-struct lists, and there is no allowed upgrade path *to*
    // a non-struct list, only *from* them.

    WirePointer* ref = origRef;
    SegmentBuilder* segment = origSegment;
    word* ptr = followFars(ref, origRefTarget, segment);

    KJ_REQUIRE(ref->kind() == WirePointer::LIST,
        "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.") {
      goto useDefault;
    }

    ElementSize oldSize = ref->listRef.elementSize();

    if (oldSize == ElementSize::INLINE_COMPOSITE) {
      // The existing element size is INLINE_COMPOSITE, though we expected a list of primitives.
      // The existing data must have been written with a newer version of the protocol.  We
      // therefore never need to upgrade the data in this case, but we do need to validate that it
      // is a valid upgrade from what we expected.

      // Read the tag to get the actual element count.
      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
          "INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      ptr += POINTER_SIZE_IN_WORDS;

      auto dataSize = tag->structRef.dataSize.get();
      auto pointerCount = tag->structRef.ptrCount.get();

      switch (elementSize) {
        case ElementSize::VOID:
          // Anything is a valid upgrade from Void.
          break;

        case ElementSize::BIT:
          KJ_FAIL_REQUIRE(
              "Schema mismatch: Found struct list where bit list was expected; upgrading boolean "
              "lists to structs is no longer supported.") {
            goto useDefault;
          }
          break;

        case ElementSize::BYTE:
        case ElementSize::TWO_BYTES:
        case ElementSize::FOUR_BYTES:
        case ElementSize::EIGHT_BYTES:
          KJ_REQUIRE(dataSize >= ONE * WORDS,
                     "Schema mismatch: Existing list value is incompatible with expected type.") {
            goto useDefault;
          }
          break;

        case ElementSize::POINTER:
          KJ_REQUIRE(pointerCount >= ONE * POINTERS,
                     "Schema mismatch: Existing list value is incompatible with expected type.") {
            goto useDefault;
          }
          // Adjust the pointer to point at the reference segment.
          ptr += dataSize;
          break;

        case ElementSize::INLINE_COMPOSITE:
          KJ_UNREACHABLE;
      }

      // OK, looks valid.

      return ListBuilder(segment, capTable, ptr,
                         tag->structRef.wordSize() * BITS_PER_WORD / ELEMENTS,
                         tag->inlineCompositeListElementCount(),
                         dataSize * BITS_PER_WORD, pointerCount, ElementSize::INLINE_COMPOSITE);
    } else {
      auto dataSize = dataBitsPerElement(oldSize) * ELEMENTS;
      auto pointerCount = pointersPerElement(oldSize) * ELEMENTS;

      if (elementSize == ElementSize::BIT) {
        KJ_REQUIRE(oldSize == ElementSize::BIT,
            "Schema mismatch: Found non-bit list where bit list was expected.") {
          goto useDefault;
        }
      } else {
        KJ_REQUIRE(oldSize != ElementSize::BIT,
            "Schema mismatch: Found bit list where non-bit list was expected.") {
          goto useDefault;
        }
        KJ_REQUIRE(dataSize >= dataBitsPerElement(elementSize) * ELEMENTS,
                   "Schema mismatch: Existing list value is incompatible with expected type.") {
          goto useDefault;
        }
        KJ_REQUIRE(pointerCount >= pointersPerElement(elementSize) * ELEMENTS,
                   "Schema mismatch: Existing list value is incompatible with expected type.") {
          goto useDefault;
        }
      }

      auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
      return ListBuilder(segment, capTable, ptr, step, ref->listRef.elementCount(),
                         dataSize, pointerCount, oldSize);
    }
  }